

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void resizeFramebuffer(_GLFWwindow *window)

{
  _GLFWwindow *window_local;
  
  if ((window->wl).fractionalScale == (wp_fractional_scale_v1 *)0x0) {
    (window->wl).fbWidth = (window->wl).width * (window->wl).bufferScale;
    (window->wl).fbHeight = (window->wl).height * (window->wl).bufferScale;
  }
  else {
    (window->wl).fbWidth = ((window->wl).width * (window->wl).scalingNumerator) / 0x78;
    (window->wl).fbHeight = ((window->wl).height * (window->wl).scalingNumerator) / 0x78;
  }
  if ((window->wl).egl.window != (wl_egl_window *)0x0) {
    (*_glfw.wl.egl.window_resize)
              ((window->wl).egl.window,(window->wl).fbWidth,(window->wl).fbHeight,0,0);
  }
  if ((window->wl).transparent == 0) {
    setContentAreaOpaque(window);
  }
  _glfwInputFramebufferSize(window,(window->wl).fbWidth,(window->wl).fbHeight);
  return;
}

Assistant:

static void resizeFramebuffer(_GLFWwindow* window)
{
    if (window->wl.fractionalScale)
    {
        window->wl.fbWidth = (window->wl.width * window->wl.scalingNumerator) / 120;
        window->wl.fbHeight = (window->wl.height * window->wl.scalingNumerator) / 120;
    }
    else
    {
        window->wl.fbWidth = window->wl.width * window->wl.bufferScale;
        window->wl.fbHeight = window->wl.height * window->wl.bufferScale;
    }

    if (window->wl.egl.window)
    {
        wl_egl_window_resize(window->wl.egl.window,
                             window->wl.fbWidth,
                             window->wl.fbHeight,
                             0, 0);
    }

    if (!window->wl.transparent)
        setContentAreaOpaque(window);

    _glfwInputFramebufferSize(window, window->wl.fbWidth, window->wl.fbHeight);
}